

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bencode.hpp
# Opt level: O0

int libtorrent::aux::write_integer<char*,unsigned_long,void>(char **out,unsigned_long data)

{
  const_iterator pvVar1;
  size_type sVar2;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  string_view str;
  array<char,_21UL> buf;
  integer_type val;
  unsigned_long data_local;
  char **out_local;
  
  ___range2 = integer_to_str((array<char,_21UL> *)((long)&str._M_str + 3),data);
  __end2 = ::std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&__range2);
  pvVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&__range2);
  for (; __end2 != pvVar1; __end2 = __end2 + 1) {
    **out = *__end2;
    *out = *out + 1;
  }
  sVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&__range2);
  return (int)sVar2;
}

Assistant:

int write_integer(OutIt& out, In data)
	{
		entry::integer_type const val = entry::integer_type(data);
		TORRENT_ASSERT(data == In(val));
		// the stack allocated buffer for keeping the
		// decimal representation of the number can
		// not hold number bigger than this:
		static_assert(sizeof(entry::integer_type) <= 8, "64 bit integers required");
		static_assert(sizeof(data) <= sizeof(entry::integer_type), "input data too big, see entry::integer_type");
		std::array<char, 21> buf;
		auto const str = integer_to_str(buf, val);
		for (char const c : str)
		{
			*out = c;
			++out;
		}
		return static_cast<int>(str.size());
	}